

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::
logAndSetTestResult(RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
                          *results)

{
  TestContext *pTVar1;
  float fVar2;
  TestLog *log;
  char *pcVar3;
  int precision;
  float fVar4;
  RenderSampleAnalyzeResult RVar5;
  string local_a0;
  string local_80;
  float local_5c;
  undefined8 uStack_58;
  float rate;
  float local_50;
  undefined8 local_48;
  RenderSampleAnalyzeResult analysis;
  undefined1 local_30 [8];
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
  mappedResults;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
  *results_local;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
  *this_local;
  
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)results;
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
  ::vector((vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
            *)local_30);
  mapResultsToRenderRateFormat
            (this,(vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                   *)local_30,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
              *)mappedResults.
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  log = tcu::TestContext::getLog
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx);
  RVar5 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
                    (log,(vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                          *)local_30);
  local_50 = RVar5.renderRateAtInfinity;
  uStack_58 = RVar5._0_8_;
  local_48._4_4_ = RVar5.renderRateAtRange;
  fVar2 = local_48._4_4_;
  local_5c = local_48._4_4_;
  local_48 = uStack_58;
  analysis.renderRateMedian = local_50;
  fVar4 = std::numeric_limits<float>::infinity();
  if ((fVar2 != fVar4) || (NAN(fVar2) || NAN(fVar4))) {
    pTVar1 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx;
    de::floatToString_abi_cxx11_
              (&local_a0,(de *)0x2,local_5c * 0.0009765625 * 0.0009765625,precision);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar3);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    pTVar1 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx;
    de::floatToString_abi_cxx11_(&local_80,(de *)0x2,0.0,precision);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar3);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
  ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
             *)local_30);
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}